

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool testing::internal::TuplePrefix<3ul>::
     Matches<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<double>>,std::tuple<int,int,double>>
               (tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>
                *matcher_tuple,tuple<int,_int,_double> *value_tuple)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<double>>,std::tuple<int,int,double>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    iVar3 = (*(((matcher_tuple->
                super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>
                ).super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
                super__Tuple_impl<2UL,_testing::Matcher<double>_>.
                super__Head_base<2UL,_testing::Matcher<double>,_false>._M_head_impl.
                super_MatcherBase<double>.impl_.value_)->super_MatcherDescriberInterface).
              _vptr_MatcherDescriberInterface[4])
                      ((value_tuple->super__Tuple_impl<0UL,_int,_int,_double>).
                       super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>.
                       super__Head_base<2UL,_double,_false>._M_head_impl);
    uVar2 = (undefined1)iVar3;
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }